

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Segment.cpp
# Opt level: O1

double __thiscall
pobr::imgProcessing::structs::Segment::getHuMomentInvariant(Segment *this,uint8_t *no)

{
  double dVar1;
  
  switch(*no) {
  case '\x01':
    dVar1 = getHuMomentInvariantNo1(this);
    return dVar1;
  case '\x02':
    dVar1 = getHuMomentInvariantNo2(this);
    return dVar1;
  case '\x03':
    dVar1 = getHuMomentInvariantNo3(this);
    return dVar1;
  case '\x04':
    dVar1 = getHuMomentInvariantNo4(this);
    return dVar1;
  case '\x05':
    dVar1 = getHuMomentInvariantNo5(this);
    return dVar1;
  case '\x06':
    dVar1 = getHuMomentInvariantNo6(this);
    return dVar1;
  case '\a':
    dVar1 = getHuMomentInvariantNo7(this);
    return dVar1;
  default:
    return -1.0;
  }
}

Assistant:

const double
Segment::getHuMomentInvariant(const uint8_t& no)
const
{
    switch (no) {
    case 1:
        return this->getHuMomentInvariantNo1();
    case 2:
        return this->getHuMomentInvariantNo2();
    case 3:
        return this->getHuMomentInvariantNo3();
    case 4:
        return this->getHuMomentInvariantNo4();
    case 5:
        return this->getHuMomentInvariantNo5();
    case 6:
        return this->getHuMomentInvariantNo6();
    case 7:
        return this->getHuMomentInvariantNo7();
    }

    return -1;
}